

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::require_polyfill(CompilerGLSL *this,Polyfill polyfill,bool relaxed)

{
  uint32_t *local_30;
  uint32_t *polyfills;
  bool relaxed_local;
  Polyfill polyfill_local;
  CompilerGLSL *this_local;
  
  if ((relaxed) && (((this->options).es & 1U) != 0)) {
    local_30 = &this->required_polyfills_relaxed;
  }
  else {
    local_30 = &this->required_polyfills;
  }
  if ((*local_30 & polyfill) == 0) {
    *local_30 = polyfill | *local_30;
    Compiler::force_recompile(&this->super_Compiler);
  }
  return;
}

Assistant:

void CompilerGLSL::require_polyfill(Polyfill polyfill, bool relaxed)
{
	uint32_t &polyfills = (relaxed && options.es) ? required_polyfills_relaxed : required_polyfills;

	if ((polyfills & polyfill) == 0)
	{
		polyfills |= polyfill;
		force_recompile();
	}
}